

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O1

int __thiscall Fl_Tabs::tab_positions(Fl_Tabs *this)

{
  size_t __size;
  uint uVar1;
  char cVar2;
  int iVar3;
  int *piVar4;
  Fl_Widget **ppFVar5;
  int iVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  int wt;
  int ht;
  int local_48 [2];
  ulong local_40;
  long local_38;
  
  uVar1 = (this->super_Fl_Group).children_;
  uVar13 = (ulong)uVar1;
  if (uVar1 != this->tab_count) {
    clear_tab_positions(this);
    if (uVar1 != 0) {
      __size = (long)(int)uVar1 * 4 + 4;
      piVar4 = (int *)malloc(__size);
      this->tab_pos = piVar4;
      piVar4 = (int *)malloc(__size);
      this->tab_width = piVar4;
    }
    this->tab_count = uVar1;
  }
  if (uVar1 == 0) {
    iVar3 = 0;
  }
  else {
    local_38 = (long)(int)uVar1;
    ppFVar5 = Fl_Group::array(&this->super_Fl_Group);
    cVar2 = fl_draw_shortcut;
    fl_draw_shortcut = '\x01';
    iVar3 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
    *this->tab_pos = iVar3;
    local_40 = uVar13;
    if ((int)uVar1 < 1) {
      uVar14 = 0;
      iVar3 = 0;
    }
    else {
      uVar14 = 0;
      uVar8 = 0;
      do {
        if ((ppFVar5[uVar14]->flags_ & 2) == 0) {
          uVar8 = uVar14 & 0xffffffff;
        }
        iVar3 = (int)uVar8;
        local_48[0] = 0;
        local_48[1] = 0;
        Fl_Label::measure(&ppFVar5[uVar14]->label_,local_48,local_48 + 1);
        this->tab_width[uVar14] = local_48[0] + 10;
        this->tab_pos[uVar14 + 1] = local_48[0] + this->tab_pos[uVar14] + 0xc;
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
    iVar6 = (this->super_Fl_Group).super_Fl_Widget.w_;
    piVar4 = this->tab_pos;
    fl_draw_shortcut = cVar2;
    if (iVar6 < piVar4[uVar14]) {
      piVar4[uVar14] = iVar6;
      piVar7 = this->tab_width;
      lVar11 = local_38;
      while (lVar9 = lVar11 + -1, lVar11 != 0) {
        iVar10 = iVar6 - piVar7[lVar9];
        if (piVar4[lVar11] < iVar10) {
          iVar10 = piVar4[lVar11];
        }
        if (piVar4[lVar9] <= iVar10) break;
        piVar4[lVar9] = iVar10;
        iVar6 = iVar6 + -10;
        lVar11 = lVar9;
      }
      iVar6 = (int)local_40;
      if (0 < iVar6) {
        piVar7 = this->tab_width;
        lVar11 = 0;
        piVar12 = piVar4;
        do {
          if (lVar11 <= *piVar12) break;
          *piVar12 = (int)lVar11;
          iVar10 = (this->super_Fl_Group).super_Fl_Widget.w_ + ~(iVar6 * 10);
          if (iVar10 < *piVar7) {
            *piVar7 = iVar10;
          }
          lVar11 = lVar11 + 10;
          piVar7 = piVar7 + 1;
          piVar12 = piVar12 + 1;
        } while (local_40 * 10 != lVar11);
      }
      if (iVar3 < iVar6) {
        piVar7 = this->tab_width;
        do {
          piVar4[local_38] = piVar7[local_38 + -1] + piVar4[local_38 + -1];
          local_38 = local_38 + -1;
        } while (iVar3 < local_38);
      }
    }
  }
  return iVar3;
}

Assistant:

int Fl_Tabs::tab_positions() {
  const int nc = children();
  if (nc != tab_count) {
    clear_tab_positions();
    if (nc) {
      tab_pos   = (int*)malloc((nc+1)*sizeof(int));
      tab_width = (int*)malloc((nc+1)*sizeof(int));
    }
    tab_count = nc;
  }
  if (nc == 0) return 0;
  int selected = 0;
  Fl_Widget*const* a = array();
  int i;
  char prev_draw_shortcut = fl_draw_shortcut;
  fl_draw_shortcut = 1;

  tab_pos[0] = Fl::box_dx(box());
  for (i=0; i<nc; i++) {
    Fl_Widget* o = *a++;
    if (o->visible()) selected = i;

    int wt = 0; int ht = 0;
    o->measure_label(wt,ht);

    tab_width[i] = wt + EXTRASPACE;
    tab_pos[i+1] = tab_pos[i] + tab_width[i] + BORDER;
  }
  fl_draw_shortcut = prev_draw_shortcut;

  int r = w();
  if (tab_pos[i] <= r) return selected;
  // uh oh, they are too big:
  // pack them against right edge:
  tab_pos[i] = r;
  for (i = nc; i--;) {
    int l = r-tab_width[i];
    if (tab_pos[i+1] < l) l = tab_pos[i+1];
    if (tab_pos[i] <= l) break;
    tab_pos[i] = l;
    r -= EXTRASPACE;
  }
  // pack them against left edge and truncate width if they still don't fit:
  for (i = 0; i<nc; i++) {
    if (tab_pos[i] >= i*EXTRASPACE) break;
    tab_pos[i] = i*EXTRASPACE;
    int W = w()-1-EXTRASPACE*(nc-i) - tab_pos[i];
    if (tab_width[i] > W) tab_width[i] = W;
  }
  // adjust edges according to visiblity:
  for (i = nc; i > selected; i--) {
    tab_pos[i] = tab_pos[i-1] + tab_width[i-1];
  }
  return selected;
}